

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

bool_t ec2SeemsValidGroup(ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  word wVar4;
  word *in_RSI;
  word *in_RDI;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  ec_o *in_stack_ffffffffffffffb0;
  word *a;
  void *in_stack_ffffffffffffffb8;
  word *pwVar5;
  ec_o *in_stack_ffffffffffffffc0;
  word *a_00;
  word *b;
  long lVar6;
  
  lVar6 = *(long *)(in_RDI[3] + 0x30);
  b = in_RSI + lVar6 + 1;
  a_00 = b + lVar6 + 2;
  pwVar5 = a_00 + lVar6 * 2;
  bVar1 = ecIsOperableGroup(in_stack_ffffffffffffffb0);
  if ((bVar1 == 0) ||
     (bVar1 = ec2IsOnA(a_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar1 == 0)) {
    return 0;
  }
  wwSetZero(in_RSI,lVar6 + 1);
  a = in_RSI;
  sVar3 = gf2Deg((qr_o *)in_RDI[3]);
  wwFlipBit(in_RSI,sVar3);
  wVar4 = zzMulW(b,(word *)in_RDI[7],lVar6 + 1,in_RDI[10]);
  b[lVar6 + 1] = wVar4;
  wVar4 = zzSubW2(b,lVar6 + 2,1);
  if (wVar4 != 0) {
    return 0;
  }
  iVar2 = wwCmp2(b,(size_t)a_00,in_RSI,(size_t)in_stack_ffffffffffffffb8);
  if (iVar2 < 0) {
    zzSub(b,a,b,lVar6 + 1);
  }
  else {
    wVar4 = zzSub2(b,a,lVar6 + 1);
    b[lVar6 + 1] = b[lVar6 + 1] - wVar4;
  }
  sVar3 = wwWordSize(b,lVar6 + 2);
  if (*(ulong *)(in_RDI[3] + 0x30) < sVar3) {
    return 0;
  }
  zzSqr(in_RDI,pwVar5,sVar3,a);
  pwVar5 = a;
  sVar3 = gf2Deg((qr_o *)in_RDI[3]);
  wwFlipBit(a,sVar3);
  sVar3 = gf2Deg((qr_o *)in_RDI[3]);
  wwFlipBit(pwVar5,sVar3 + 2);
  iVar2 = wwCmp2(b,(size_t)a_00,in_RSI,(size_t)pwVar5);
  return (uint)(iVar2 < 1);
}

Assistant:

bool_t ec2SeemsValidGroup(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n + 1;
	word* t3 = t2 + n + 2;
	stack = t3 + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec));
	// ecIsOperableGroup(ec) == TRUE? base \in ec?
	if (!ecIsOperableGroup(ec) ||
		!ec2IsOnA(ec->base, ec, stack))
		return FALSE;
	// [n + 1]t1 <- 2^m
	wwSetZero(t1, n + 1);
	wwFlipBit(t1, gf2Deg(ec->f));
	// [n + 2]t2 <- order * cofactor
	t2[n + 1] = zzMulW(t2, ec->order, n + 1, ec->cofactor);
	// t2 <- |t2 - (2^m + 1)|
	if (zzSubW2(t2, n + 2, 1))
		return FALSE;
	if (wwCmp2(t2, n + 2, t1, n + 1) >= 0)
		t2[n + 1] -= zzSub2(t2, t1, n + 1);
	else
		zzSub(t2, t1, t2, n + 1);
	// n <- длина t2
	n = wwWordSize(t2, n + 2);
	// n > ec->f->n => t2^2 > 4 2^m
	if (n > ec->f->n)
		return FALSE;
	// [2n]t3 <- ([n]t2)^2
	zzSqr(t3, t2, n, stack);
	// t1 <- 4 2^m
	wwFlipBit(t1, gf2Deg(ec->f));
	wwFlipBit(t1, gf2Deg(ec->f) + 2);
	// условие Хассе: t3 <= 4 2^m?
	return wwCmp2(t3, 2 * n, t3, ec->f->n + 1) <= 0;
}